

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void setup_superres(AV1_COMMON *cm,aom_read_bit_buffer *rb,int *width,int *height)

{
  byte bVar1;
  int iVar2;
  
  cm->superres_upscaled_width = *width;
  cm->superres_upscaled_height = *height;
  if (cm->seq_params->enable_superres != '\0') {
    iVar2 = aom_rb_read_bit(rb);
    if (iVar2 != 0) {
      iVar2 = aom_rb_read_literal(rb,3);
      bVar1 = (char)iVar2 + 9;
      cm->superres_scale_denominator = bVar1;
      av1_calculate_scaled_superres_size(width,height,(uint)bVar1);
      return;
    }
    cm->superres_scale_denominator = '\b';
  }
  return;
}

Assistant:

static inline void setup_superres(AV1_COMMON *const cm,
                                  struct aom_read_bit_buffer *rb, int *width,
                                  int *height) {
  cm->superres_upscaled_width = *width;
  cm->superres_upscaled_height = *height;

  const SequenceHeader *const seq_params = cm->seq_params;
  if (!seq_params->enable_superres) return;

  if (aom_rb_read_bit(rb)) {
    cm->superres_scale_denominator =
        (uint8_t)aom_rb_read_literal(rb, SUPERRES_SCALE_BITS);
    cm->superres_scale_denominator += SUPERRES_SCALE_DENOMINATOR_MIN;
    // Don't edit cm->width or cm->height directly, or the buffers won't get
    // resized correctly
    av1_calculate_scaled_superres_size(width, height,
                                       cm->superres_scale_denominator);
  } else {
    // 1:1 scaling - ie. no scaling, scale not provided
    cm->superres_scale_denominator = SCALE_NUMERATOR;
  }
}